

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Matches(OnCallSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&>>
                    ((tuple<testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                      *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_&>
               ::Matches((MatcherBase<const_std::tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_&>
                          *)(this + 0x88),args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }